

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

StringEntry * __thiscall
cmELFInternalImpl<cmELFTypes32>::GetDynamicSectionString
          (cmELFInternalImpl<cmELFTypes32> *this,uint tag)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  pointer paVar3;
  istream *piVar4;
  cmELF *pcVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  ulong uVar8;
  pointer paVar9;
  long *plVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  _Base_ptr p_Var16;
  bool bVar17;
  char c;
  char local_45;
  uint local_44;
  ulong local_40;
  pointer local_38;
  
  p_Var6 = (this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header;
    p_Var16 = &p_Var1->_M_header;
    do {
      bVar17 = p_Var6[1]._M_color < tag;
      if (!bVar17) {
        p_Var16 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar17];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var16 != p_Var1) && (p_Var16[1]._M_color <= tag)) {
      if (p_Var16[2]._M_parent == (_Base_ptr)0x0) {
        return (mapped_type *)0x0;
      }
      return (StringEntry *)&p_Var16[1]._M_parent;
    }
  }
  local_44 = tag;
  pmVar7 = std::
           map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
           ::operator[](&(this->super_cmELFInternal).DynamicSectionStrings,&local_44);
  pmVar7->Position = 0;
  pmVar7->Size = 0;
  pmVar7->IndexInSection = -1;
  bVar17 = LoadDynamicSection(this);
  if (!bVar17) {
    return (mapped_type *)0x0;
  }
  local_38 = (this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>.
             _M_impl.super__Vector_impl_data._M_start;
  uVar13 = (ulong)local_38[(this->super_cmELFInternal).DynamicSectionIndex].sh_link;
  uVar8 = ((long)(this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)local_38 >> 3) *
          -0x3333333333333333;
  if (uVar8 < uVar13 || uVar8 - uVar13 == 0) {
    pcVar5 = (this->super_cmELFInternal).External;
    pcVar12 = (char *)(pcVar5->ErrorMessage)._M_string_length;
    pcVar11 = "Section DYNAMIC has invalid string table index.";
  }
  else {
    paVar9 = (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar3 = (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (paVar9 == paVar3) {
      return (mapped_type *)0x0;
    }
    local_38 = local_38 + uVar13;
    lVar14 = -(long)paVar9;
    while (paVar9->d_tag != local_44) {
      paVar9 = paVar9 + 1;
      lVar14 = lVar14 + -8;
      if (paVar9 == paVar3) {
        return (mapped_type *)0x0;
      }
    }
    uVar8 = (ulong)(paVar9->d_un).d_val;
    uVar2 = local_38->sh_size;
    if ((paVar9->d_un).d_val < uVar2) {
      bVar15 = 0;
      std::istream::seekg((this->super_cmELFInternal).Stream,local_38->sh_offset + uVar8,0);
      local_40 = uVar8;
      do {
        plVar10 = (long *)std::istream::get((char *)(this->super_cmELFInternal).Stream);
        uVar13 = uVar8;
        if (((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) ||
           ((bool)(bVar15 & local_45 != '\0'))) break;
        if (local_45 == '\0') {
          bVar15 = 1;
        }
        else {
          std::__cxx11::string::push_back((char)pmVar7);
        }
        uVar8 = uVar8 + 1;
        uVar13 = (ulong)uVar2;
      } while (uVar2 != uVar8);
      piVar4 = (this->super_cmELFInternal).Stream;
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
        pmVar7->Position = local_38->sh_offset + local_40;
        pmVar7->Size = uVar13 - local_40;
        pmVar7->IndexInSection =
             (int)((ulong)-((long)&((this->DynamicSectionEntries).
                                    super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->d_tag + lVar14) >> 3)
        ;
        return pmVar7;
      }
      pcVar5 = (this->super_cmELFInternal).External;
      std::__cxx11::string::_M_replace
                ((ulong)&pcVar5->ErrorMessage,0,(char *)(pcVar5->ErrorMessage)._M_string_length,
                 0x1b5d08);
      (this->super_cmELFInternal).ELFType = FileTypeInvalid;
      std::__cxx11::string::_M_replace
                ((ulong)pmVar7,0,(char *)(pmVar7->Value)._M_string_length,0x1bb872);
      return (mapped_type *)0x0;
    }
    pcVar5 = (this->super_cmELFInternal).External;
    pcVar12 = (char *)(pcVar5->ErrorMessage)._M_string_length;
    pcVar11 = "Section DYNAMIC references string beyond the end of its string section.";
  }
  std::__cxx11::string::_M_replace((ulong)&pcVar5->ErrorMessage,0,pcVar12,(ulong)pcVar11);
  (this->super_cmELFInternal).ELFType = FileTypeInvalid;
  return (mapped_type *)0x0;
}

Assistant:

cmELF::StringEntry const*
cmELFInternalImpl<Types>::GetDynamicSectionString(unsigned int tag)
{
  // Short-circuit if already checked.
  std::map<unsigned int, StringEntry>::iterator dssi =
    this->DynamicSectionStrings.find(tag);
  if(dssi != this->DynamicSectionStrings.end())
    {
    if(dssi->second.Position > 0)
      {
      return &dssi->second;
      }
    return 0;
    }

  // Create an entry for this tag.  Assume it is missing until found.
  StringEntry& se = this->DynamicSectionStrings[tag];
  se.Position = 0;
  se.Size = 0;
  se.IndexInSection = -1;

  // Try reading the dynamic section.
  if(!this->LoadDynamicSection())
    {
    return 0;
    }

  // Get the string table referenced by the DYNAMIC section.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if(sec.sh_link >= this->SectionHeaders.size())
    {
    this->SetErrorMessage("Section DYNAMIC has invalid string table index.");
    return 0;
    }
  ELF_Shdr const& strtab = this->SectionHeaders[sec.sh_link];

  // Look for the requested entry.
  for(typename std::vector<ELF_Dyn>::iterator
        di = this->DynamicSectionEntries.begin();
      di != this->DynamicSectionEntries.end(); ++di)
    {
    ELF_Dyn& dyn = *di;
    if(static_cast<tagtype>(dyn.d_tag) == static_cast<tagtype>(tag))
      {
      // We found the tag requested.
      // Make sure the position given is within the string section.
      if(dyn.d_un.d_val >= strtab.sh_size)
        {
        this->SetErrorMessage("Section DYNAMIC references string beyond "
                              "the end of its string section.");
        return 0;
        }

      // Seek to the position reported by the entry.
      unsigned long first = static_cast<unsigned long>(dyn.d_un.d_val);
      unsigned long last = first;
      unsigned long end = static_cast<unsigned long>(strtab.sh_size);
      this->Stream.seekg(strtab.sh_offset + first);

      // Read the string.  It may be followed by more than one NULL
      // terminator.  Count the total size of the region allocated to
      // the string.  This assumes that the next string in the table
      // is non-empty, but the "chrpath" tool makes the same
      // assumption.
      bool terminated = false;
      char c;
      while(last != end && this->Stream.get(c) && !(terminated && c))
        {
        ++last;
        if(c)
          {
          se.Value += c;
          }
        else
          {
          terminated = true;
          }
        }

      // Make sure the whole value was read.
      if(!this->Stream)
        {
        this->SetErrorMessage("Dynamic section specifies unreadable RPATH.");
        se.Value = "";
        return 0;
        }

      // The value has been read successfully.  Report it.
      se.Position = static_cast<unsigned long>(strtab.sh_offset + first);
      se.Size = last - first;
      se.IndexInSection =
        static_cast<int>(di - this->DynamicSectionEntries.begin());
      return &se;
      }
    }
  return 0;
}